

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void parse_options(int argc,char **argv,int program,_func_void_varargs *help,
                  _func_void_varargs *version)

{
  option_type_t oVar1;
  cartridge_t cart;
  int iVar2;
  option_t *poVar3;
  char *pcVar4;
  size_t sVar5;
  ushort **ppuVar6;
  _func_void_varargs *p_Var7;
  int iVar8;
  _func_void_varargs *__s;
  _func_void_varargs *p_Var9;
  ulong uVar10;
  code cVar11;
  undefined1 in_stack_ffffffffffffffa4 [12];
  undefined4 in_stack_ffffffffffffffb8;
  
  poVar3 = get_option("-o");
  pcVar4 = (char *)mmalloc(7);
  (poVar3->value).str = pcVar4;
  builtin_strncpy(pcVar4,"out.gb",7);
  if (1 < argc) {
    uVar10 = 1;
    do {
      if ((*argv[uVar10] == '-') && (poVar3 = get_option(argv[uVar10]), poVar3 != (option_t *)0x0))
      {
        pcVar4 = poVar3->name;
        iVar2 = strcmp(pcVar4,"--help");
        if ((iVar2 == 0) || (iVar2 = strcmp(pcVar4,"--version"), iVar2 == 0)) {
          poVar3->set = 1;
        }
      }
      uVar10 = uVar10 + 1;
    } while ((uint)argc != uVar10);
  }
  poVar3 = get_option("--help");
  if ((poVar3->set != 0) ||
     (__s = help, poVar3 = get_option("--version"), help = version, poVar3->set != 0)) {
    (*help)();
    return;
  }
  if (1 < argc) {
    iVar2 = 1;
    do {
      p_Var7 = (_func_void_varargs *)argv[iVar2];
      if (*p_Var7 != (_func_void_varargs)0x2d) {
        file_add((char *)p_Var7);
        goto LAB_00103cde;
      }
      poVar3 = get_option((char *)p_Var7);
      p_Var9 = __s;
      if (poVar3 == (option_t *)0x0) {
LAB_00103cc8:
        pcVar4 = "unrecognized command line option \'%s\'.";
        __s = p_Var7;
LAB_00103cd7:
        ccerr(E,pcVar4,__s);
        __s = p_Var9;
      }
      else {
        __s = (_func_void_varargs *)poVar3->name;
        sVar5 = strlen((char *)__s);
        p_Var9 = __s;
        if (program == 2) {
          if (poVar3->ld_opt != 0) goto LAB_00103c16;
          goto LAB_00103cc8;
        }
        if ((program == 1) && (poVar3->as_opt == 0)) goto LAB_00103cc8;
LAB_00103c16:
        poVar3->set = 1;
        oVar1 = poVar3->type;
        if (oVar1 == flag) {
          if (p_Var7[sVar5] == (_func_void_varargs)0x0) goto LAB_00103cde;
          goto LAB_00103cc8;
        }
        if (oVar1 != string) {
          if (oVar1 != number) goto LAB_00103cde;
          cVar11 = p_Var7[sVar5];
          if (cVar11 != (code)0x0) {
            ppuVar6 = __ctype_b_loc();
            p_Var7 = p_Var7 + sVar5;
            iVar8 = 0;
            do {
              p_Var7 = p_Var7 + 1;
              if ((*(byte *)((long)*ppuVar6 + (long)(char)cVar11 * 2 + 1) & 8) == 0) {
                pcVar4 = "argument to \'%s\' should be a non-negative integer.";
                p_Var9 = __s;
                goto LAB_00103cd7;
              }
              iVar8 = (int)(char)cVar11 + iVar8 * 10 + -0x30;
              cVar11 = *p_Var7;
            } while (cVar11 != (code)0x0);
            (poVar3->value).num = iVar8;
            goto LAB_00103cde;
          }
          pcVar4 = "missing argument to \'%s\'";
          goto LAB_00103cd7;
        }
        sVar5 = strlen((char *)__s);
        p_Var9 = p_Var7 + sVar5;
        if (p_Var7[sVar5] == (_func_void_varargs)0x0) {
          if ((p_Var9[-1] == (_func_void_varargs)0x3d) || (iVar2 == argc + -1)) {
            pcVar4 = poVar3->argname;
          }
          else {
            p_Var9 = (_func_void_varargs *)argv[(long)iVar2 + 1];
            if (*p_Var9 != (_func_void_varargs)0x0) {
              iVar2 = iVar2 + 1;
              goto LAB_00103c98;
            }
            pcVar4 = poVar3->argname;
          }
          ccerr(E,"missing %s after \'%s\'",pcVar4,__s);
        }
        else {
LAB_00103c98:
          pcVar4 = (poVar3->value).str;
          sVar5 = strlen((char *)p_Var9);
          pcVar4 = (char *)mrealloc(pcVar4,sVar5 + 1);
          (poVar3->value).str = pcVar4;
          strcpy(pcVar4,(char *)p_Var9);
        }
      }
LAB_00103cde:
      iVar2 = iVar2 + 1;
    } while (iVar2 < argc);
  }
  iVar2 = file_count();
  if (iVar2 == 0) {
    ccerr(F,"no input files.");
  }
  poVar3 = get_option("-E");
  iVar2 = poVar3->set;
  poVar3 = get_option("-S");
  iVar8 = poVar3->set;
  poVar3 = get_option("-c");
  if ((((iVar2 != 0 || iVar8 != 0) || poVar3->set != 0) &&
      (poVar3 = get_option("-o"), poVar3->set != 0)) && (iVar2 = file_count(), 1 < iVar2)) {
    pcVar4 = "cannot specify -o with -c with multiple files";
    if (program == 0) {
      pcVar4 = "cannot specify -o with -E, -S or -c with multiple files";
    }
    ccerr(F,pcVar4);
  }
  poVar3 = get_option("-ftabstop=");
  if ((poVar3->value).num - 0x65U < 0xffffff9c) {
    (poVar3->value).num = 8;
    poVar3->set = 0;
  }
  cart.cart_type = in_stack_ffffffffffffffa4._0_4_;
  cart.rom_size = in_stack_ffffffffffffffa4._4_4_;
  cart.ram_size = in_stack_ffffffffffffffa4._8_4_;
  cart.gb_type = 0x202020;
  cart.title._0_8_ = __s;
  cart.title[8] = (char)in_stack_ffffffffffffffb8;
  cart.title[9] = (char)((uint)in_stack_ffffffffffffffb8 >> 8);
  cart.title[10] = (char)((uint)in_stack_ffffffffffffffb8 >> 0x10);
  cart._27_1_ = (char)((uint)in_stack_ffffffffffffffb8 >> 0x18);
  set_cartridge(cart);
  return;
}

Assistant:

void parse_options(int argc, char** argv, int program, void(*help)(),
                   void(*version)())
{
    int i;
    option_t* opt;

    opt = get_option("-o");
    opt->value.str = (char*)mmalloc(7);
    strcpy(opt->value.str, "out.gb");

    for (i = 1; i < argc; ++i)
    {
        char* p = argv[i];
        if (*p == '-')
        {
            opt = get_option(p);
            if (!opt)
                continue;
            if (strcmp(opt->name, "--help") == 0)
                opt->set = 1;
            else if (strcmp(opt->name, "--version") == 0)
                opt->set = 1;
        }
    }

    /* Leave the function before source files are added */
    if (get_option("--help")->set)
    {
        (*help)();
        return;
    }

    if (get_option("--version")->set)
    {
        (*version)();
        return;
    }

    for (i = 1; i < argc; ++i)
    {
        char* p = argv[i];
        if (*p == '-')
        {
            /* HANDLE ADDITIONAL INCLUDE PATHS LIB PATHS ETC HERE */
            if ((opt = get_option(argv[i])))
            {
                p += strlen(opt->name);

                if (program == GBAS && !opt->as_opt)
                {
                    ccerr(E, "unrecognized command line option '%s'.", argv[i]);
                    continue;
                }

                if (program == GBLD && !opt->ld_opt)
                {
                    ccerr(E, "unrecognized command line option '%s'.", argv[i]);
                    continue;
                }

                opt->set = 1;
                if (opt->type != flag)
                {
                    if (opt->type == number)
                        read_number(p, opt);
                    else if (opt->type == string)
                        read_string(opt, &i, argc, argv);
                }
                else if (*p)
                {
                    /* Option name matched but there were additional
                    characters */
                    ccerr(E, "unrecognized command line option '%s'.", argv[i]);
                    continue;
                }
            }
            else
                ccerr(E, "unrecognized command line option '%s'.", argv[i]);
        }
        else
        {
            file_add(argv[i]);
        }
    }

    if (!file_count())
        ccerr(F, "no input files.");

    if ( (get_option("-E")->set | get_option("-S")->set | get_option("-c")->set)
         && get_option("-o")->set)
    {
        if (file_count() > 1)
        {
            if (program == GBCC)
                ccerr(F, "cannot specify -o with -E, -S or -c with multiple "
                         "files");
            else
                ccerr(F, "cannot specify -o with -c with multiple files");

        }
    }

    opt = get_option("-ftabstop=");
    if (opt->value.num < 1 || opt->value.num > 100)
    {
        opt->value.num = 8;
        opt->set = 0;
    }
    
    set_cartridge(cartridge);
}